

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

void __thiscall
RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::RandomTestData
          (RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> *this,
          wchar_t in_delim,size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  __normal_iterator<wchar_t_*,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> local_38;
  const_iterator local_30;
  size_t local_28;
  size_t in_fixed_word_length_local;
  size_t in_fixed_word_count_local;
  RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> *pRStack_10;
  wchar_t in_delim_local;
  RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> *this_local;
  
  local_28 = in_fixed_word_length;
  in_fixed_word_length_local = in_fixed_word_count;
  in_fixed_word_count_local._4_4_ = in_delim;
  pRStack_10 = this;
  std::vector<wchar_t,_std::allocator<wchar_t>_>::vector(&this->m_delim);
  this->m_fixed_word_count = in_fixed_word_length_local;
  this->m_fixed_word_length = local_28;
  std::vector<wchar_t,_std::allocator<wchar_t>_>::vector(&this->m_str);
  std::
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  ::vector(&this->m_tokens);
  local_38._M_current =
       (wchar_t *)std::vector<wchar_t,_std::allocator<wchar_t>_>::end(&this->m_delim);
  __gnu_cxx::__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>>::
  __normal_iterator<wchar_t*>
            ((__normal_iterator<wchar_t_const*,std::vector<wchar_t,std::allocator<wchar_t>>> *)
             &local_30,&local_38);
  std::vector<wchar_t,_std::allocator<wchar_t>_>::insert
            (&this->m_delim,local_30,(value_type_conflict3 *)((long)&in_fixed_word_count_local + 4))
  ;
  populate(this);
  return;
}

Assistant:

RandomTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}